

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O2

bool jbcoin::passesLocalChecks(STObject *st,string *reason)

{
  byte bVar1;
  SField *pSVar2;
  STBase *pSVar3;
  bool bVar4;
  int iVar5;
  STArray *this;
  byte *pbVar6;
  ulong uVar7;
  STBase **ppSVar8;
  size_type sVar9;
  ulong uVar10;
  ulong uVar11;
  pointer pSVar12;
  pointer pSVar13;
  allocator local_a1;
  string *local_a0;
  pointer local_98;
  pointer local_90;
  Serializer s;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> data;
  string symbols;
  
  bVar4 = STObject::isFieldPresent(st,(SField *)sfMemos);
  if (bVar4) {
    this = STObject::getFieldArray(st,(SField *)sfMemos);
    Serializer::Serializer(&s,0x800);
    STArray::add(this,&s);
    if (0x400 < (int)s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
                (int)s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
      std::__cxx11::string::assign((char *)reason);
LAB_001ded49:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&s);
      return false;
    }
    local_98 = (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    local_a0 = reason;
    for (pSVar13 = (this->v_).
                   super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>._M_impl.
                   super__Vector_impl_data._M_start; pSVar13 != local_98; pSVar13 = pSVar13 + 1) {
      if (((pSVar13->super_STBase).fName)->fieldCode != sfMemo) {
        std::__cxx11::string::assign((char *)local_a0);
        goto LAB_001ded49;
      }
      local_90 = (pSVar13->v_).
                 super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      for (pSVar12 = (pSVar13->v_).
                     super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>
                     ._M_impl.super__Vector_impl_data._M_start; pSVar12 != local_90;
          pSVar12 = pSVar12 + 1) {
        pSVar2 = pSVar12->p_->fName;
        iVar5 = pSVar2->fieldCode;
        if (((iVar5 != sfMemoType) && (iVar5 != sfMemoData)) && (iVar5 != sfMemoFormat)) {
          std::__cxx11::string::assign((char *)local_a0);
          goto LAB_001ded49;
        }
        (*pSVar12->p_->_vptr_STBase[6])(&symbols);
        strUnHex(&data,&symbols);
        std::__cxx11::string::~string((string *)&symbols);
        if (data.second == false) {
          std::__cxx11::string::assign((char *)local_a0);
LAB_001ded3f:
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
          goto LAB_001ded49;
        }
        if (pSVar2->fieldCode != sfMemoData) {
          pbVar6 = data.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((isMemoOkay(jbcoin::STObject_const&,std::__cxx11::string&)::allowedSymbols == '\0') &&
             (iVar5 = __cxa_guard_acquire(&isMemoOkay(jbcoin::STObject_const&,std::__cxx11::string&)
                                           ::allowedSymbols),
             pbVar6 = data.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start, iVar5 != 0)) {
            memset(isMemoOkay(jbcoin::STObject_const&,std::__cxx11::string&)::allowedSymbols,0,0x100
                  );
            std::__cxx11::string::string
                      ((string *)&symbols,
                       "0123456789-._~:/?#[]@!$&\'()*+,;=%ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
                       ,&local_a1);
            for (sVar9 = 0; symbols._M_string_length != sVar9; sVar9 = sVar9 + 1) {
              isMemoOkay(jbcoin::STObject_const&,std::__cxx11::string&)::allowedSymbols
              [symbols._M_dataplus._M_p[sVar9]] = 1;
            }
            std::__cxx11::string::~string((string *)&symbols);
            __cxa_guard_release(&isMemoOkay(jbcoin::STObject_const&,std::__cxx11::string&)::
                                 allowedSymbols);
            pbVar6 = data.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          }
          while (pbVar6 != data.first.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish) {
            bVar1 = *pbVar6;
            pbVar6 = pbVar6 + 1;
            if (isMemoOkay(jbcoin::STObject_const&,std::__cxx11::string&)::allowedSymbols[bVar1] ==
                '\0') {
              std::__cxx11::string::assign((char *)local_a0);
              goto LAB_001ded3f;
            }
          }
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
      }
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&s);
    reason = local_a0;
  }
  pSVar12 = (st->v_).
            super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(st->v_).
                 super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pSVar12) / 0x60;
  uVar11 = 0;
  iVar5 = (int)uVar7;
  uVar7 = uVar7 & 0xffffffff;
  if (iVar5 < 1) {
    uVar7 = uVar11;
  }
  ppSVar8 = &pSVar12->p_;
  while ((uVar10 = uVar7, uVar7 != uVar11 &&
         (((pSVar3 = *ppSVar8, pSVar3 == (STBase *)0x0 ||
           (pSVar3->_vptr_STBase != (_func_int **)&PTR__STBase_002f7f40)) ||
          (uVar10 = uVar11, *(char *)((long)&pSVar3[2]._vptr_STBase + 4) == '\0'))))) {
    uVar11 = uVar11 + 1;
    ppSVar8 = ppSVar8 + 0xc;
  }
  if (((long)iVar5 <= (long)uVar10) && (bVar4 = isPseudoTx(st), !bVar4)) {
    return true;
  }
  std::__cxx11::string::assign((char *)reason);
  return false;
}

Assistant:

bool passesLocalChecks (STObject const& st, std::string& reason)
{
    if (!isMemoOkay (st, reason))
        return false;

    if (!isAccountFieldOkay (st))
    {
        reason = "An account field is invalid.";
        return false;
    }

    if (isPseudoTx(st))
    {
        reason = "Cannot submit pseudo transactions.";
        return false;
    }
    return true;
}